

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O2

void __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadMeshLodInfo(OgreBinarySerializer *this,Mesh *mesh)

{
  uint16_t uVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  size_t sVar4;
  DeadlyImportError *pDVar5;
  ulong uVar6;
  bool bVar7;
  allocator local_9a;
  char local_99;
  string local_98;
  Mesh *local_78;
  string local_70;
  string local_50;
  
  local_78 = mesh;
  ReadLine_abi_cxx11_(&local_50,this);
  std::__cxx11::string::~string((string *)&local_50);
  uVar1 = Read<unsigned_short>(this);
  local_99 = Read<bool>(this);
  uVar6 = 1;
  while( true ) {
    if (uVar1 <= uVar6) {
      return;
    }
    uVar2 = ReadHeader(this,true);
    if (uVar2 != 0x8100) break;
    StreamReader<false,_false>::IncPtr(this->m_reader,4);
    if (local_99 == '\0') {
      sVar4 = Ogre::Mesh::NumSubMeshes(local_78);
      while (bVar7 = sVar4 != 0, sVar4 = sVar4 - 1, bVar7) {
        uVar2 = ReadHeader(this,true);
        if (uVar2 != 0x8120) {
          pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string
                    ((string *)&local_98,
                     "Generated M_MESH_LOD_USAGE does not contain M_MESH_LOD_GENERATED",&local_9a);
          DeadlyImportError::DeadlyImportError(pDVar5,&local_98);
          __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
        uVar3 = Read<unsigned_int>(this);
        bVar7 = Read<bool>(this);
        if (uVar3 != 0) {
          StreamReader<false,_false>::IncPtr(this->m_reader,(ulong)(uVar3 << bVar7 + 1));
        }
      }
    }
    else {
      uVar2 = ReadHeader(this,true);
      if (uVar2 != 0x8110) {
        pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string
                  ((string *)&local_98,"Manual M_MESH_LOD_USAGE does not contain M_MESH_LOD_MANUAL",
                   &local_9a);
        DeadlyImportError::DeadlyImportError(pDVar5,&local_98);
        __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      ReadLine_abi_cxx11_(&local_70,this);
      std::__cxx11::string::~string((string *)&local_70);
    }
    uVar6 = uVar6 + 1;
  }
  pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string
            ((string *)&local_98,"M_MESH_LOD does not contain a M_MESH_LOD_USAGE for each LOD level"
             ,&local_9a);
  DeadlyImportError::DeadlyImportError(pDVar5,&local_98);
  __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void OgreBinarySerializer::ReadMeshLodInfo(Mesh *mesh)
{
    // Assimp does not acknowledge LOD levels as far as I can see it. This info is just skipped.
    // @todo Put this stuff to scene/mesh custom properties. If manual mesh the app can use the information.
    ReadLine(); // strategy name
    uint16_t numLods = Read<uint16_t>();
    bool manual = Read<bool>();

    /// @note Main mesh is considered as LOD 0, start from index 1.
    for (size_t i=1; i<numLods; ++i)
    {
        uint16_t id = ReadHeader();
        if (id != M_MESH_LOD_USAGE) {
            throw DeadlyImportError("M_MESH_LOD does not contain a M_MESH_LOD_USAGE for each LOD level");
        }

        m_reader->IncPtr(sizeof(float)); // user value

        if (manual)
        {
            id = ReadHeader();
            if (id != M_MESH_LOD_MANUAL) {
                throw DeadlyImportError("Manual M_MESH_LOD_USAGE does not contain M_MESH_LOD_MANUAL");
            }

            ReadLine(); // manual mesh name (ref to another mesh)
        }
        else
        {
            for(size_t si=0, silen=mesh->NumSubMeshes(); si<silen; ++si)
            {
                id = ReadHeader();
                if (id != M_MESH_LOD_GENERATED) {
                    throw DeadlyImportError("Generated M_MESH_LOD_USAGE does not contain M_MESH_LOD_GENERATED");
                }

                uint32_t indexCount = Read<uint32_t>();
                bool is32bit = Read<bool>();

                if (indexCount > 0)
                {
                    uint32_t len = indexCount * (is32bit ? sizeof(uint32_t) : sizeof(uint16_t));
                    m_reader->IncPtr(len);
                }
            }
        }
    }
}